

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O1

int greatest_name_match(char *name,char *filter)

{
  char cVar1;
  char cVar2;
  int iVar3;
  size_t __n;
  
  __n = strlen(filter);
  cVar2 = *name;
  if (cVar2 != '\0') {
    cVar1 = *filter;
    do {
      if ((cVar2 == cVar1) && (iVar3 = strncmp(name,filter,__n), iVar3 == 0)) {
        return 1;
      }
      cVar2 = name[1];
      name = name + 1;
    } while (cVar2 != '\0');
  }
  return 0;
}

Assistant:

int
main(int argc, char ** argv) {
    srandom(time(NULL));
    GREATEST_MAIN_BEGIN();
    RUN_SUITE(generic_pack_unpack_le);
    RUN_SUITE(generic_pack_unpack_be);
    RUN_SUITE(generic_mixed_endian);
    RUN_SUITE(plan);
    GREATEST_MAIN_END();
}